

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O1

bool __thiscall
cmConditionEvaluator::HandleLevel4
          (cmConditionEvaluator *this,cmArgumentList *newArgs,string *errorString,
          MessageType *status)

{
  iterator iVar1;
  bool bVar2;
  bool bVar3;
  cmConditionEvaluator *pcVar4;
  iterator argP2;
  iterator arg;
  int reducible;
  iterator argP1;
  iterator local_50;
  iterator local_48;
  int local_3c;
  iterator local_38;
  
  do {
    local_3c = 0;
    local_48._M_node =
         (newArgs->
         super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>).
         _M_impl._M_node.super__List_node_base._M_next;
    local_50._M_node = (_List_node_base *)0x0;
    for (; local_48._M_node != (_List_node_base *)newArgs;
        local_48._M_node =
             (((_List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *)
              &(local_48._M_node)->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      local_38._M_node = local_48._M_node;
      if (local_48._M_node != (_List_node_base *)newArgs) {
        local_38._M_node = (local_48._M_node)->_M_next;
        local_50._M_node = local_38._M_node;
        if (local_38._M_node != (_List_node_base *)newArgs) {
          local_50._M_node = (local_38._M_node)->_M_next;
        }
      }
      if (local_38._M_node != (_List_node_base *)newArgs) {
        bVar2 = IsKeyword(this,&keyAND_abi_cxx11_,
                          (cmExpandedCommandArgument *)(local_38._M_node + 1));
        iVar1._M_node = local_50._M_node;
        if ((bVar2) && (local_50._M_node != (_List_node_base *)newArgs)) {
          bVar2 = GetBooleanValueWithAutoDereference
                            (this,(cmExpandedCommandArgument *)(local_48._M_node + 1),errorString,
                             status,false);
          pcVar4 = this;
          bVar3 = GetBooleanValueWithAutoDereference
                            (this,(cmExpandedCommandArgument *)(iVar1._M_node + 1),errorString,
                             status,false);
          HandleBinaryOp(pcVar4,bVar3 && bVar2,&local_3c,&local_48,newArgs,&local_38,&local_50);
        }
      }
      if (local_38._M_node != (_List_node_base *)newArgs) {
        bVar2 = IsKeyword(this,&keyOR_abi_cxx11_,(cmExpandedCommandArgument *)(local_38._M_node + 1)
                         );
        iVar1._M_node = local_50._M_node;
        if ((bVar2) && (local_50._M_node != (_List_node_base *)newArgs)) {
          bVar2 = GetBooleanValueWithAutoDereference
                            (this,(cmExpandedCommandArgument *)(local_48._M_node + 1),errorString,
                             status,false);
          pcVar4 = this;
          bVar3 = GetBooleanValueWithAutoDereference
                            (this,(cmExpandedCommandArgument *)(iVar1._M_node + 1),errorString,
                             status,false);
          HandleBinaryOp(pcVar4,bVar3 || bVar2,&local_3c,&local_48,newArgs,&local_38,&local_50);
        }
      }
    }
  } while (local_3c != 0);
  return true;
}

Assistant:

bool cmConditionEvaluator::HandleLevel4(cmArgumentList& newArgs,
                                        std::string& errorString,
                                        MessageType& status)
{
  int reducible;
  bool lhs;
  bool rhs;
  do {
    reducible = 0;
    cmArgumentList::iterator arg = newArgs.begin();
    cmArgumentList::iterator argP1;
    cmArgumentList::iterator argP2;
    while (arg != newArgs.end()) {
      argP1 = arg;
      IncrementArguments(newArgs, argP1, argP2);
      if (argP1 != newArgs.end() && IsKeyword(keyAND, *argP1) &&
          argP2 != newArgs.end()) {
        lhs =
          this->GetBooleanValueWithAutoDereference(*arg, errorString, status);
        rhs = this->GetBooleanValueWithAutoDereference(*argP2, errorString,
                                                       status);
        this->HandleBinaryOp((lhs && rhs), reducible, arg, newArgs, argP1,
                             argP2);
      }

      if (argP1 != newArgs.end() && this->IsKeyword(keyOR, *argP1) &&
          argP2 != newArgs.end()) {
        lhs =
          this->GetBooleanValueWithAutoDereference(*arg, errorString, status);
        rhs = this->GetBooleanValueWithAutoDereference(*argP2, errorString,
                                                       status);
        this->HandleBinaryOp((lhs || rhs), reducible, arg, newArgs, argP1,
                             argP2);
      }
      ++arg;
    }
  } while (reducible);
  return true;
}